

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)7>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,long *n,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  xml_node local_30;
  
  if (*n == 0) {
    pxVar1 = (xml_node_struct *)0x0;
  }
  else {
    pxVar1 = *(xml_node_struct **)(*n + 0x30);
  }
  if (pxVar1 != (xml_node_struct *)0x0) {
    do {
      local_30._root = pxVar1;
      step_push(this,ns,&local_30,alloc);
      pxVar1 = pxVar1->next_sibling;
    } while (pxVar1 != (xml_node_struct *)0x0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xml_node& n, xpath_allocator* alloc, T)
		{
			const axis_t axis = T::axis;

			switch (axis)
			{
			case axis_attribute:
			{
				for (xml_attribute a = n.first_attribute(); a; a = a.next_attribute())
					step_push(ns, a, n, alloc);
				
				break;
			}
			
			case axis_child:
			{
				for (xml_node c = n.first_child(); c; c = c.next_sibling())
					step_push(ns, c, alloc);
					
				break;
			}
			
			case axis_descendant:
			case axis_descendant_or_self:
			{
				if (axis == axis_descendant_or_self)
					step_push(ns, n, alloc);
					
				xml_node cur = n.first_child();
				
				while (cur && cur != n)
				{
					step_push(ns, cur, alloc);
					
					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (!cur.next_sibling() && cur != n)
							cur = cur.parent();
					
						if (cur != n) cur = cur.next_sibling();
					}
				}
				
				break;
			}
			
			case axis_following_sibling:
			{
				for (xml_node c = n.next_sibling(); c; c = c.next_sibling())
					step_push(ns, c, alloc);
				
				break;
			}
			
			case axis_preceding_sibling:
			{
				for (xml_node c = n.previous_sibling(); c; c = c.previous_sibling())
					step_push(ns, c, alloc);
				
				break;
			}
			
			case axis_following:
			{
				xml_node cur = n;

				// exit from this node so that we don't include descendants
				while (cur && !cur.next_sibling()) cur = cur.parent();
				cur = cur.next_sibling();

				for (;;)
				{
					step_push(ns, cur, alloc);

					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (cur && !cur.next_sibling()) cur = cur.parent();
						cur = cur.next_sibling();

						if (!cur) break;
					}
				}

				break;
			}

			case axis_preceding:
			{
				xml_node cur = n;

				while (cur && !cur.previous_sibling()) cur = cur.parent();
				cur = cur.previous_sibling();

				for (;;)
				{
					if (cur.last_child())
						cur = cur.last_child();
					else
					{
						// leaf node, can't be ancestor
						step_push(ns, cur, alloc);

						if (cur.previous_sibling())
							cur = cur.previous_sibling();
						else
						{
							do 
							{
								cur = cur.parent();
								if (!cur) break;

								if (!node_is_ancestor(cur, n)) step_push(ns, cur, alloc);
							}
							while (!cur.previous_sibling());

							cur = cur.previous_sibling();

							if (!cur) break;
						}
					}
				}

				break;
			}
			
			case axis_ancestor:
			case axis_ancestor_or_self:
			{
				if (axis == axis_ancestor_or_self)
					step_push(ns, n, alloc);

				xml_node cur = n.parent();
				
				while (cur)
				{
					step_push(ns, cur, alloc);
					
					cur = cur.parent();
				}
				
				break;
			}

			case axis_self:
			{
				step_push(ns, n, alloc);

				break;
			}

			case axis_parent:
			{
				if (n.parent()) step_push(ns, n.parent(), alloc);

				break;
			}
				
			default:
				assert(!"Unimplemented axis");
			}
		}